

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O3

bool __thiscall
cmdline::parser::option_with_value<unsigned_int>::set
          (option_with_value<unsigned_int> *this,string *value)

{
  uint uVar1;
  
  uVar1 = (*(this->super_option_base)._vptr_option_base[0xc])();
  this->actual = uVar1;
  this->has = true;
  return true;
}

Assistant:

bool set(const std::string &value){
      try{
        actual=read(value);
        has=true;
      }
      catch(const std::exception &e){
        return false;
      }
      return true;
    }